

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HistogramBasedDistribution.cpp
# Opt level: O1

int __thiscall HistogramBasedDistribution::getMedian(HistogramBasedDistribution *this)

{
  pointer ppVar1;
  int *piVar2;
  int in_EAX;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  float fVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  
  ppVar1 = (this->values).
           super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  uVar4 = (long)(this->values).
                super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)ppVar1 >> 4;
  uVar5 = 0;
  dVar10 = 0.0;
  do {
    dVar9 = dVar10;
    if (uVar4 == uVar5) {
      return in_EAX;
    }
    uVar5 = uVar5 + 1;
    iVar3 = this->max;
    if (uVar5 < uVar4) {
      iVar3 = ppVar1[1].first + -1;
    }
    piVar2 = &ppVar1->first;
    dVar8 = (double)((iVar3 - *piVar2) + 1);
    dVar7 = ppVar1->second * dVar8;
    dVar10 = dVar9 + dVar7;
    ppVar1 = ppVar1 + 1;
  } while (dVar10 < 0.5);
  fVar6 = roundf((float)(((0.5 - dVar9) * dVar8) / dVar7 + (double)*piVar2));
  return (int)fVar6;
}

Assistant:

int HistogramBasedDistribution::getMedian() {
	double p_sum = 0.0;
	for (size_t i=0; i<values.size(); ++i) {
		int start = values[i].first;
		int end = (i+1 < values.size())? values[i+1].first-1:max;
		int length = end - start + 1;
		double p = values[i].second * length;
		if (p_sum + p >= 0.5) {
			return (int)roundf(start + ((double)length)*(0.5-p_sum)/p);
		}
		p_sum += p;
	}
	assert(false);
}